

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_model(Net *this,DataReader *dr)

{
  pointer ppLVar1;
  pointer ppLVar2;
  Layer *pLVar3;
  int iVar4;
  int iVar5;
  PoolAllocator *pPVar6;
  uint uVar7;
  ulong uVar8;
  ModelBinFromDataReader mb;
  Option opt1;
  ModelBinFromDataReader local_88;
  undefined4 local_78;
  int iStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  ppLVar1 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar1 == ppLVar2) {
    load_model();
    iVar4 = -1;
  }
  else {
    ModelBinFromDataReader::ModelBinFromDataReader(&local_88,dr);
    uVar7 = (uint)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3);
    if ((int)uVar7 < 1) {
      iVar4 = 0;
    }
    else {
      uVar8 = 0;
      do {
        pLVar3 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8];
        if (pLVar3 == (Layer *)0x0) {
          fprintf(_stderr,"load_model error at layer %d, parameter file has inconsistent content.",
                  uVar8 & 0xffffffff);
LAB_00165c87:
          fputc(10,_stderr);
          iVar4 = -1;
          goto LAB_00165b23;
        }
        iVar4 = (*pLVar3->_vptr_Layer[3])(pLVar3,&local_88);
        if (iVar4 != 0) {
          fprintf(_stderr,"layer load_model %d %s failed",uVar8 & 0xffffffff,
                  (pLVar3->name)._M_dataplus._M_p);
          goto LAB_00165c87;
        }
        if (pLVar3->support_int8_storage == true) {
          (this->opt).use_vulkan_compute = false;
        }
        uVar8 = uVar8 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar8);
      iVar4 = 0;
LAB_00165b23:
      if (0 < (int)uVar7) {
        uVar8 = 0;
        do {
          pLVar3 = (this->d->layers).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
          local_78 = *(undefined4 *)&this->opt;
          iStack_74 = (this->opt).num_threads;
          uStack_70 = *(undefined4 *)&(this->opt).blob_allocator;
          uStack_6c = *(undefined4 *)((long)&(this->opt).blob_allocator + 4);
          local_68 = *(undefined4 *)&(this->opt).workspace_allocator;
          uStack_64 = *(undefined4 *)((long)&(this->opt).workspace_allocator + 4);
          iStack_60 = (this->opt).openmp_blocktime;
          uStack_5c._0_1_ = (this->opt).use_winograd_convolution;
          uStack_5c._1_1_ = (this->opt).use_sgemm_convolution;
          uStack_5c._2_1_ = (this->opt).use_int8_inference;
          uStack_5c._3_1_ = (this->opt).use_vulkan_compute;
          local_58._0_1_ = (this->opt).use_bf16_storage;
          local_58._1_1_ = (this->opt).use_fp16_packed;
          local_58._2_1_ = (this->opt).use_fp16_storage;
          local_58._3_1_ = (this->opt).use_fp16_arithmetic;
          uStack_54._0_1_ = (this->opt).use_int8_packed;
          uStack_54._1_1_ = (this->opt).use_int8_storage;
          uStack_54._2_1_ = (this->opt).use_int8_arithmetic;
          uStack_54._3_1_ = (this->opt).use_packing_layout;
          uStack_50._0_1_ = (this->opt).use_shader_pack8;
          uStack_50._1_1_ = (this->opt).use_subgroup_basic;
          uStack_50._2_1_ = (this->opt).use_subgroup_vote;
          uStack_50._3_1_ = (this->opt).use_subgroup_ballot;
          uStack_4c._0_1_ = (this->opt).use_subgroup_shuffle;
          uStack_4c._1_1_ = (this->opt).use_image_storage;
          uStack_4c._2_1_ = (this->opt).use_tensor_storage;
          uStack_4c._3_1_ = (this->opt).use_reserved_0;
          local_48 = (this->opt).flush_denormals;
          uStack_44._0_1_ = (this->opt).use_local_pool_allocator;
          uStack_44._1_1_ = (this->opt).use_shader_local_memory;
          uStack_44._2_1_ = (this->opt).use_cooperative_matrix;
          uStack_44._3_1_ = (this->opt).use_winograd23_convolution;
          uStack_40._0_1_ = (this->opt).use_winograd43_convolution;
          uStack_40._1_1_ = (this->opt).use_winograd63_convolution;
          uStack_40._2_1_ = (this->opt).use_reserved_6;
          uStack_40._3_1_ = (this->opt).use_reserved_7;
          uStack_3c._0_1_ = (this->opt).use_reserved_8;
          uStack_3c._1_1_ = (this->opt).use_reserved_9;
          uStack_3c._2_1_ = (this->opt).use_reserved_10;
          uStack_3c._3_1_ = (this->opt).use_reserved_11;
          iVar5 = (*pLVar3->_vptr_Layer[4])(pLVar3,&local_78);
          if (iVar5 != 0) {
            load_model();
            iVar4 = -1;
            break;
          }
          uVar8 = uVar8 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar8);
      }
    }
    if ((this->opt).use_local_pool_allocator == true) {
      if (((this->opt).blob_allocator == (Allocator *)0x0) &&
         (this->d->local_blob_allocator == (PoolAllocator *)0x0)) {
        pPVar6 = (PoolAllocator *)operator_new(0x10);
        PoolAllocator::PoolAllocator(pPVar6);
        this->d->local_blob_allocator = pPVar6;
        PoolAllocator::set_size_compare_ratio(pPVar6,0.0);
      }
      if (((this->opt).workspace_allocator == (Allocator *)0x0) &&
         (this->d->local_workspace_allocator == (PoolAllocator *)0x0)) {
        pPVar6 = (PoolAllocator *)operator_new(0x10);
        PoolAllocator::PoolAllocator(pPVar6);
        this->d->local_workspace_allocator = pPVar6;
        PoolAllocator::set_size_compare_ratio(pPVar6,0.5);
      }
    }
    ModelBinFromDataReader::~ModelBinFromDataReader(&local_88);
  }
  return iVar4;
}

Assistant:

int Net::load_model(const DataReader& dr)
{
    if (d->layers.empty())
    {
        NCNN_LOGE("network graph not ready");
        return -1;
    }

    int layer_count = (int)d->layers.size();

    // load file
    int ret = 0;

    ModelBinFromDataReader mb(dr);
    for (int i = 0; i < layer_count; i++)
    {
        Layer* layer = d->layers[i];

        //Here we found inconsistent content in the parameter file.
        if (!layer)
        {
            NCNN_LOGE("load_model error at layer %d, parameter file has inconsistent content.", i);
            ret = -1;
            break;
        }

        int lret = layer->load_model(mb);
        if (lret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_model %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_model %d failed", i);
#endif
            ret = -1;
            break;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!opt.pipeline_cache)
        {
            if (!d->pipeline_cache)
                d->pipeline_cache = new PipelineCache(d->vkdev);
            opt.pipeline_cache = d->pipeline_cache;
        }
    }
#endif // NCNN_VULKAN

    for (int i = 0; i < layer_count; i++)
    {
        Layer* layer = d->layers[i];

        Option opt1 = opt;
#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
        {
            if (!layer->support_image_storage) opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        int cret = layer->create_pipeline(opt1);
        if (cret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer create_pipeline %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer create_pipeline %d failed", i);
#endif
            ret = -1;
            break;
        }
    }

    if (opt.use_local_pool_allocator)
    {
        if (opt.blob_allocator == 0)
        {
            if (!d->local_blob_allocator)
            {
                d->local_blob_allocator = new PoolAllocator;
                d->local_blob_allocator->set_size_compare_ratio(0.f);
            }
        }
        if (opt.workspace_allocator == 0)
        {
            if (!d->local_workspace_allocator)
            {
                d->local_workspace_allocator = new PoolAllocator;
                d->local_workspace_allocator->set_size_compare_ratio(0.5f);
            }
        }
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        d->upload_model();
    }
#endif // NCNN_VULKAN

    return ret;
}